

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanDebug.cpp
# Opt level: O0

VkBool32 VulkanUtilities::anon_unknown_0::DebugReportCallback
                   (VkDebugReportFlagsEXT flags,VkDebugReportObjectTypeEXT objectType,
                   uint64_t object,size_t location,int32_t messageCode,char *pLayerPrefix,
                   char *pMessage,void *pUserData)

{
  undefined *puVar1;
  undefined4 uVar2;
  ostream *poVar3;
  undefined8 uVar4;
  undefined1 auVar5 [16];
  string local_218 [32];
  undefined8 local_1f8;
  undefined1 local_1f0 [8];
  string _msg;
  stringstream local_1c0 [8];
  stringstream debugMessage;
  ostream local_1b0 [380];
  undefined4 local_34;
  char *pcStack_30;
  DEBUG_MESSAGE_SEVERITY MsgSeverity;
  char *pLayerPrefix_local;
  size_t sStack_20;
  int32_t messageCode_local;
  size_t location_local;
  uint64_t object_local;
  VkDebugReportObjectTypeEXT objectType_local;
  VkDebugReportFlagsEXT flags_local;
  
  if ((flags & 8) == 0) {
    if ((flags & 6) == 0) {
      local_34 = 0;
    }
    else {
      local_34 = 1;
    }
  }
  else {
    local_34 = 2;
  }
  pcStack_30 = pLayerPrefix;
  pLayerPrefix_local._4_4_ = messageCode;
  sStack_20 = location;
  location_local = object;
  object_local._0_4_ = objectType;
  object_local._4_4_ = flags;
  std::__cxx11::stringstream::stringstream(local_1c0);
  std::operator<<(local_1b0,"Vulkan debug message");
  if (pcStack_30 != (char *)0x0) {
    poVar3 = std::operator<<(local_1b0," (");
    poVar3 = std::operator<<(poVar3,pcStack_30);
    std::operator<<(poVar3,")");
  }
  if (pMessage != (char *)0x0) {
    poVar3 = std::operator<<(local_1b0,": ");
    std::operator<<(poVar3,pMessage);
  }
  std::__cxx11::stringstream::str();
  auVar5 = std::__cxx11::string::c_str();
  local_1f8 = auVar5._0_8_;
  Diligent::FormatString<char_const*>((string *)local_1f0,(Diligent *)&local_1f8,auVar5._8_8_);
  std::__cxx11::string::~string(local_218);
  uVar2 = local_34;
  puVar1 = Diligent::DebugMessageCallback;
  if (Diligent::DebugMessageCallback != (undefined *)0x0) {
    uVar4 = std::__cxx11::string::c_str();
    (*(code *)puVar1)(uVar2,uVar4,0);
  }
  std::__cxx11::string::~string((string *)local_1f0);
  std::__cxx11::stringstream::~stringstream(local_1c0);
  return 0;
}

Assistant:

VkBool32 VKAPI_PTR DebugReportCallback(
    VkDebugReportFlagsEXT      flags,
    VkDebugReportObjectTypeEXT objectType,
    uint64_t                   object,       // the object where the issue was detected
    size_t                     location,     // a component (layer, driver, loader) defined value specifying the location of the trigger. This is an optional value.
    int32_t                    messageCode,  // is a layer-defined value indicating what test triggered this callback.
    const char*                pLayerPrefix, // a null-terminated string that is an abbreviation of the name of the component making the callback.
    const char*                pMessage,     // a null-terminated string detailing the trigger conditions.
    void*                      pUserData)
{
    auto MsgSeverity = DEBUG_MESSAGE_SEVERITY_INFO;
    if (flags & VK_DEBUG_REPORT_ERROR_BIT_EXT)
    {
        MsgSeverity = DEBUG_MESSAGE_SEVERITY_ERROR;
    }
    else if (flags & (VK_DEBUG_REPORT_WARNING_BIT_EXT | VK_DEBUG_REPORT_PERFORMANCE_WARNING_BIT_EXT))
    {
        MsgSeverity = DEBUG_MESSAGE_SEVERITY_WARNING;
    }
    else if (flags & (VK_DEBUG_REPORT_INFORMATION_BIT_EXT | VK_DEBUG_REPORT_DEBUG_BIT_EXT))
    {
        MsgSeverity = DEBUG_MESSAGE_SEVERITY_INFO;
    }

    std::stringstream debugMessage;
    debugMessage << "Vulkan debug message";
    if (pLayerPrefix != nullptr)
        debugMessage << " (" << pLayerPrefix << ")";

    if (pMessage != nullptr)
        debugMessage << ": " << pMessage;

    LOG_DEBUG_MESSAGE(MsgSeverity, debugMessage.str().c_str());

    // The callback returns a VkBool32, which is interpreted in a layer-specified manner.
    // The application should always return VK_FALSE. The VK_TRUE value is reserved for
    // use in layer development.
    return VK_FALSE;
}